

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void deqp::gls::FboUtil::logField(TestLog *log,string *field,string *value)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1a0;
  string *local_20;
  string *value_local;
  string *field_local;
  TestLog *log_local;
  
  local_20 = value;
  value_local = field;
  field_local = (string *)log;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1a0,value_local);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a0a8b4);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_20);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

static void logField (TestLog& log, const string& field, const string& value)
{
	log << TestLog::Message << field << ": " << value << TestLog::EndMessage;
}